

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::Curve::Create(vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                    *__return_storage_ptr__,Transform *renderFromObject,Transform *objectFromRender,
                   bool reverseOrientation,ParameterDictionary *parameters,FileLoc *loc,
                   Allocator alloc)

{
  pointer pPVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar12;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined8 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  span<const_pbrt::Normal3<float>_> norm;
  bool bVar34;
  int iVar35;
  int iVar36;
  memory_resource *pmVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  span<const_pbrt::Point3<float>_> c_00;
  string ret;
  int degree;
  string curveType;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> c;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> cp;
  string basis;
  undefined1 local_138 [8];
  float fStack_130;
  undefined4 uStack_12c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  float fStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  float fStack_10c;
  int local_100;
  int local_fc;
  Float local_f8;
  CurveType local_f4;
  string local_f0;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_d0;
  int local_b8;
  Float local_b4;
  undefined1 local_b0 [32];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_90;
  string local_78;
  Transform *local_58;
  Transform *local_50;
  int local_44;
  long local_40;
  ulong uStack_38;
  
  local_138 = (undefined1  [8])&aStack_128;
  local_58 = renderFromObject;
  local_50 = objectFromRender;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"width","");
  local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_138,1.0);
  if (local_138 != (undefined1  [8])&aStack_128) {
    operator_delete((void *)local_138,
                    CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                             aStack_128._M_allocated_capacity._0_4_) + 1);
  }
  local_138 = (undefined1  [8])&aStack_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"width0","");
  local_b4 = ParameterDictionary::GetOneFloat(parameters,(string *)local_138,local_f8);
  if (local_138 != (undefined1  [8])&aStack_128) {
    operator_delete((void *)local_138,
                    CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                             aStack_128._M_allocated_capacity._0_4_) + 1);
  }
  local_138 = (undefined1  [8])&aStack_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"width1","");
  local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_138,local_f8);
  if (local_138 != (undefined1  [8])&aStack_128) {
    operator_delete((void *)local_138,
                    CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                             aStack_128._M_allocated_capacity._0_4_) + 1);
  }
  local_138 = (undefined1  [8])&aStack_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"degree","");
  local_fc = ParameterDictionary::GetOneInt(parameters,(string *)local_138,3);
  if (local_138 != (undefined1  [8])&aStack_128) {
    operator_delete((void *)local_138,
                    CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                             aStack_128._M_allocated_capacity._0_4_) + 1);
  }
  if (local_fc - 4U < 0xfffffffe) {
    fStack_130 = 0.0;
    uStack_12c = 0;
    aStack_128._M_allocated_capacity._0_4_ = aStack_128._M_allocated_capacity._0_4_ & 0xffffff00;
    local_138 = (undefined1  [8])&aStack_128;
    detail::stringPrintfRecursive<int&>
              ((string *)local_138,"Invalid degree %d: only degree 2 and 3 curves are supported.",
               &local_fc);
    Error(loc,(char *)local_138);
    if (local_138 != (undefined1  [8])&aStack_128) {
      operator_delete((void *)local_138,
                      CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                               aStack_128._M_allocated_capacity._0_4_) + 1);
    }
    pmVar37 = pstd::pmr::new_delete_resource();
    (__return_storage_ptr__->alloc).memoryResource = pmVar37;
    __return_storage_ptr__->nStored = 0;
    __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
    __return_storage_ptr__->nAlloc = 0;
    return __return_storage_ptr__;
  }
  local_138 = (undefined1  [8])&aStack_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"basis","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"bezier","");
  ParameterDictionary::GetOneString(&local_78,parameters,(string *)local_138,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != (undefined1  [8])&aStack_128) {
    operator_delete((void *)local_138,
                    CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                             aStack_128._M_allocated_capacity._0_4_) + 1);
  }
  iVar35 = std::__cxx11::string::compare((char *)&local_78);
  if ((iVar35 != 0) && (iVar35 = std::__cxx11::string::compare((char *)&local_78), iVar35 != 0)) {
    fStack_130 = 0.0;
    uStack_12c = 0;
    aStack_128._M_allocated_capacity._0_4_ = aStack_128._M_allocated_capacity._0_4_ & 0xffffff00;
    local_138 = (undefined1  [8])&aStack_128;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)local_138,
               "Invalid basis \"%s\": only \"bezier\" and \"bspline\" are supported.",&local_78);
    Error(loc,(char *)local_138);
    if (local_138 != (undefined1  [8])&aStack_128) {
      operator_delete((void *)local_138,
                      CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                               aStack_128._M_allocated_capacity._0_4_) + 1);
    }
    pmVar37 = pstd::pmr::new_delete_resource();
    (__return_storage_ptr__->alloc).memoryResource = pmVar37;
    __return_storage_ptr__->nStored = 0;
    __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
    __return_storage_ptr__->nAlloc = 0;
    goto LAB_0021bb25;
  }
  local_138 = (undefined1  [8])&aStack_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"P","");
  ParameterDictionary::GetPoint3fArray(&local_90,parameters,(string *)local_138);
  if (local_138 != (undefined1  [8])&aStack_128) {
    operator_delete((void *)local_138,
                    CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                             aStack_128._M_allocated_capacity._0_4_) + 1);
  }
  iVar35 = std::__cxx11::string::compare((char *)&local_78);
  uVar41 = (ulong)local_fc;
  uVar39 = ((long)local_90.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_90.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  iVar36 = (int)uVar39;
  if (iVar35 == 0) {
    if ((~uVar41 + uVar39) % uVar41 == 0) {
      local_100 = (int)((uVar39 - 1) / uVar41);
      goto LAB_0021b2ef;
    }
    fStack_130 = 0.0;
    uStack_12c = 0;
    local_f0._M_dataplus._M_p._0_4_ = iVar36;
    local_b0._0_4_ = local_fc + 1;
    aStack_128._M_allocated_capacity._0_4_ =
         (uint)(uint3)aStack_128._M_allocated_capacity._1_3_ << 8;
    local_138 = (undefined1  [8])&aStack_128;
    detail::stringPrintfRecursive<int,int&,int,int&>
              ((string *)local_138,
               "Invalid number of control points %d: for the degree %d Bezier basis %d + n * %d are required, for n >= 0."
               ,(int *)&local_f0,&local_fc,(int *)local_b0,&local_fc);
    Error(loc,(char *)local_138);
LAB_0021b2a8:
    if (local_138 != (undefined1  [8])&aStack_128) {
      operator_delete((void *)local_138,
                      CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                               aStack_128._M_allocated_capacity._0_4_) + 1);
    }
    pmVar37 = pstd::pmr::new_delete_resource();
    (__return_storage_ptr__->alloc).memoryResource = pmVar37;
    __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
    __return_storage_ptr__->nAlloc = 0;
    __return_storage_ptr__->nStored = 0;
  }
  else {
    if (uVar39 < (ulong)(long)(local_fc + 1)) {
      fStack_130 = 0.0;
      uStack_12c = 0;
      local_f0._M_dataplus._M_p._0_4_ = iVar36;
      local_b0._0_4_ = local_fc + 1;
      aStack_128._M_allocated_capacity._0_4_ =
           (uint)(uint3)aStack_128._M_allocated_capacity._1_3_ << 8;
      local_138 = (undefined1  [8])&aStack_128;
      detail::stringPrintfRecursive<int,int&,int>
                ((string *)local_138,
                 "Invalid number of control points %d: for the degree %d b-spline basis, must have >= %d."
                 ,(int *)&local_f0,&local_fc,(int *)local_b0);
      Error(loc,(char *)local_138);
      goto LAB_0021b2a8;
    }
    local_100 = iVar36 - local_fc;
LAB_0021b2ef:
    local_138 = (undefined1  [8])&aStack_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"type","");
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"flat","");
    ParameterDictionary::GetOneString(&local_f0,parameters,(string *)local_138,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if (local_138 != (undefined1  [8])&aStack_128) {
      operator_delete((void *)local_138,
                      CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                               aStack_128._M_allocated_capacity._0_4_) + 1);
    }
    iVar35 = std::__cxx11::string::compare((char *)&local_f0);
    if (iVar35 == 0) {
      bVar34 = false;
      local_f4 = Flat;
    }
    else {
      iVar35 = std::__cxx11::string::compare((char *)&local_f0);
      if (iVar35 == 0) {
        local_f4 = Ribbon;
        bVar34 = true;
      }
      else {
        iVar35 = std::__cxx11::string::compare((char *)&local_f0);
        local_f4 = Cylinder;
        if (iVar35 != 0) {
          fStack_130 = 0.0;
          uStack_12c = 0;
          aStack_128._M_allocated_capacity._0_4_ =
               aStack_128._M_allocated_capacity._0_4_ & 0xffffff00;
          local_138 = (undefined1  [8])&aStack_128;
          detail::stringPrintfRecursive<std::__cxx11::string&>
                    ((string *)local_138,"Unknown curve type \"%s\".  Using \"cylinder\".",&local_f0
                    );
          Error(loc,(char *)local_138);
          if (local_138 != (undefined1  [8])&aStack_128) {
            operator_delete((void *)local_138,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     aStack_128._M_allocated_capacity._0_4_) + 1);
          }
        }
        bVar34 = false;
      }
    }
    local_138 = (undefined1  [8])&aStack_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"N","");
    ParameterDictionary::GetNormal3fArray(&local_d0,parameters,(string *)local_138);
    if (local_138 != (undefined1  [8])&aStack_128) {
      operator_delete((void *)local_138,
                      CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                               aStack_128._M_allocated_capacity._0_4_) + 1);
    }
    if (local_d0.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_d0.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (!bVar34) goto LAB_0021b590;
      Error(loc,"Must provide normals \"N\" at curve endpoints with ribbon curves.");
LAB_0021bab0:
      pmVar37 = pstd::pmr::new_delete_resource();
      (__return_storage_ptr__->alloc).memoryResource = pmVar37;
      __return_storage_ptr__->nStored = 0;
      __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
      __return_storage_ptr__->nAlloc = 0;
    }
    else {
      if (bVar34) {
        lVar38 = ((long)local_d0.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_d0.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (lVar38 - ((long)local_100 + 1) != 0) {
          fStack_130 = 0.0;
          uStack_12c = 0;
          local_b0._0_4_ = (int)lVar38;
          local_44 = (int)((long)local_100 + 1);
          aStack_128._M_allocated_capacity._0_4_ =
               (uint)(uint3)aStack_128._M_allocated_capacity._1_3_ << 8;
          local_138 = (undefined1  [8])&aStack_128;
          detail::stringPrintfRecursive<int,int,int&>
                    ((string *)local_138,
                     "Invalid number of normals %d: must provide %d normals for ribbon curves with %d segments."
                     ,(int *)local_b0,&local_44,&local_100);
          Error(loc,(char *)local_138);
          if (local_138 != (undefined1  [8])&aStack_128) {
            operator_delete((void *)local_138,
                            CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                     aStack_128._M_allocated_capacity._0_4_) + 1);
          }
          goto LAB_0021bab0;
        }
      }
      else {
        fStack_130 = 0.0;
        uStack_12c = 0;
        aStack_128._M_allocated_capacity._0_4_ =
             (uint)(uint3)aStack_128._M_allocated_capacity._1_3_ << 8;
        local_138 = (undefined1  [8])&aStack_128;
        detail::stringPrintfRecursive
                  ((string *)local_138,"Curve normals are only used with \"ribbon\" type curves.");
        Warning((FileLoc *)0x0,(char *)local_138);
        if (local_138 != (undefined1  [8])&aStack_128) {
          operator_delete((void *)local_138,
                          CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                   aStack_128._M_allocated_capacity._0_4_) + 1);
        }
        std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>::
        _M_assign_aux<pbrt::Normal3<float>const*>
                  ((vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>> *)&local_d0,0,
                   0);
      }
LAB_0021b590:
      local_138 = (undefined1  [8])&aStack_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"splitdepth","");
      local_b8 = ParameterDictionary::GetOneInt(parameters,(string *)local_138,3);
      if (local_138 != (undefined1  [8])&aStack_128) {
        operator_delete((void *)local_138,
                        CONCAT44(aStack_128._M_allocated_capacity._4_4_,
                                 aStack_128._M_allocated_capacity._0_4_) + 1);
      }
      if ((bVar34) &&
         (local_d0.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_d0.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        Error(loc,"Must provide normals \"N\" at curve endpoints with ribbon curves.");
        goto LAB_0021bab0;
      }
      (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
      __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
      __return_storage_ptr__->nAlloc = 0;
      __return_storage_ptr__->nStored = 0;
      if (0 < local_100) {
        lVar42 = 0;
        lVar38 = 0;
        iVar35 = 0;
        do {
          fStack_118 = 0.0;
          uStack_114 = 0;
          uStack_110 = 0;
          fStack_10c = 0.0;
          local_138 = (undefined1  [8])0x0;
          fStack_130 = 0.0;
          uStack_12c = 0;
          aStack_128._M_allocated_capacity._0_4_ = 0;
          aStack_128._M_allocated_capacity._4_4_ = 0;
          aStack_128._8_8_ = 0;
          iVar36 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar36 == 0) {
            if (local_fc == 2) {
              fVar47 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 1].
                       super_Tuple3<pbrt::Point3,_float>.z;
              uVar5 = local_90.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar35].
                      super_Tuple3<pbrt::Point3,_float>.x;
              uVar15 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar35].
                       super_Tuple3<pbrt::Point3,_float>.y;
              auVar50._4_4_ = uVar15;
              auVar50._0_4_ = uVar5;
              auVar50._8_8_ = 0;
              fStack_130 = local_90.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar35].
                           super_Tuple3<pbrt::Point3,_float>.z;
              auVar43._8_4_ = 0x3eaaaaaa;
              auVar43._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar43._12_4_ = 0x3eaaaaaa;
              auVar43 = vmulps_avx512vl(auVar50,auVar43);
              aStack_128._M_allocated_capacity._4_4_ =
                   local_90.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar35].
                   super_Tuple3<pbrt::Point3,_float>.z * 0.3333333 + fVar47 * 0.6666667;
              fStack_118 = fVar47 * 0.6666666 +
                           local_90.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                           super_Tuple3<pbrt::Point3,_float>.z * 0.33333334;
              uVar6 = local_90.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 1].
                      super_Tuple3<pbrt::Point3,_float>.x;
              uVar16 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 1].
                       super_Tuple3<pbrt::Point3,_float>.y;
              auVar48._4_4_ = uVar16;
              auVar48._0_4_ = uVar6;
              auVar48._8_8_ = 0;
              auVar44._8_4_ = 0x3f2aaaab;
              auVar44._0_8_ = 0x3f2aaaab3f2aaaab;
              auVar44._12_4_ = 0x3f2aaaab;
              auVar44 = vmulps_avx512vl(auVar48,auVar44);
              auVar45._8_4_ = 0x3f2aaaaa;
              auVar45._0_8_ = 0x3f2aaaaa3f2aaaaa;
              auVar45._12_4_ = 0x3f2aaaaa;
              auVar45 = vmulps_avx512vl(auVar48,auVar45);
              auVar51._0_4_ = auVar43._0_4_ + auVar44._0_4_;
              auVar51._4_4_ = auVar43._4_4_ + auVar44._4_4_;
              auVar51._8_4_ = auVar43._8_4_ + auVar44._8_4_;
              auVar51._12_4_ = auVar43._12_4_ + auVar44._12_4_;
              uVar7 = local_90.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                      super_Tuple3<pbrt::Point3,_float>.x;
              uVar17 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                       super_Tuple3<pbrt::Point3,_float>.y;
              auVar53._4_4_ = uVar17;
              auVar53._0_4_ = uVar7;
              auVar53._8_8_ = 0;
              auVar46._8_4_ = 0x3eaaaaab;
              auVar46._0_8_ = 0x3eaaaaab3eaaaaab;
              auVar46._12_4_ = 0x3eaaaaab;
              auVar43 = vmulps_avx512vl(auVar53,auVar46);
              local_138 = *(undefined1 (*) [8])
                           &local_90.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar35].
                            super_Tuple3<pbrt::Point3,_float>;
              uVar12 = vmovlps_avx(auVar51);
              uStack_12c = (undefined4)uVar12;
              aStack_128._M_allocated_capacity._0_4_ = (undefined4)((ulong)uVar12 >> 0x20);
              auVar49._0_4_ = auVar45._0_4_ + auVar43._0_4_;
              auVar49._4_4_ = auVar45._4_4_ + auVar43._4_4_;
              auVar49._8_4_ = auVar45._8_4_ + auVar43._8_4_;
              auVar49._12_4_ = auVar45._12_4_ + auVar43._12_4_;
              aStack_128._8_8_ = vmovlps_avx(auVar49);
              fStack_10c = local_90.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                           super_Tuple3<pbrt::Point3,_float>.z;
              uVar22 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                       super_Tuple3<pbrt::Point3,_float>.x;
              uVar23 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                       super_Tuple3<pbrt::Point3,_float>.y;
              iVar36 = 2;
              uStack_114 = uVar22;
              uStack_110 = uVar23;
            }
            else {
              pPVar1 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar35;
              local_138 = *(undefined1 (*) [8])&pPVar1->super_Tuple3<pbrt::Point3,_float>;
              uVar12 = *(undefined8 *)&(pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
              uVar29 = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.y;
              uVar30 = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.z;
              aStack_128._8_4_ = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.x;
              aStack_128._12_4_ = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.y;
              uVar31 = *(undefined8 *)
                        &local_90.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 2].
                         super_Tuple3<pbrt::Point3,_float>.z;
              uVar32 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 3].
                       super_Tuple3<pbrt::Point3,_float>.y;
              uVar33 = local_90.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar35 + 3].
                       super_Tuple3<pbrt::Point3,_float>.z;
              fStack_118 = (float)uVar31;
              uStack_114 = (undefined4)((ulong)uVar31 >> 0x20);
              fStack_130 = (float)uVar12;
              uStack_12c = (undefined4)((ulong)uVar12 >> 0x20);
              iVar36 = local_fc;
              aStack_128._M_allocated_capacity._0_4_ = uVar29;
              aStack_128._M_allocated_capacity._4_4_ = uVar30;
              uStack_110 = uVar32;
              fStack_10c = (float)uVar33;
            }
          }
          else {
            pPVar1 = local_90.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + iVar35;
            if (local_fc == 2) {
              fVar47 = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.z;
              uVar3 = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.x;
              uVar13 = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.y;
              uVar39._0_4_ = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.x;
              uVar39._4_4_ = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.y;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar39;
              fStack_130 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z * 0.5 + fVar47 * 0.5;
              auVar60._0_4_ = (float)(undefined4)uVar39 * 0.5 + (float)uVar3 * 0.5;
              auVar60._4_4_ = (float)uVar39._4_4_ * 0.5 + (float)uVar13 * 0.5;
              auVar60._8_8_ = 0;
              auVar24._8_4_ = 0x3eaaaaab;
              auVar24._0_8_ = 0x3eaaaaab3eaaaaab;
              auVar24._12_4_ = 0x3eaaaaab;
              auVar43 = vmulps_avx512vl(auVar60,auVar24);
              fStack_10c = fVar47 * 0.5 + pPVar1[2].super_Tuple3<pbrt::Point3,_float>.z * 0.5;
              aStack_128._M_allocated_capacity._4_4_ = fStack_130 * 0.3333333 + fVar47 * 0.6666667;
              fStack_118 = fStack_10c * 0.33333334 + fVar47 * 0.6666666;
              uVar4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
              uVar14 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
              auVar25._8_4_ = 0x3f2aaaab;
              auVar25._0_8_ = 0x3f2aaaab3f2aaaab;
              auVar25._12_4_ = 0x3f2aaaab;
              auVar44 = vmulps_avx512vl(auVar55,auVar25);
              auVar26._8_4_ = 0x3f2aaaaa;
              auVar26._0_8_ = 0x3f2aaaaa3f2aaaaa;
              auVar26._12_4_ = 0x3f2aaaaa;
              auVar45 = vmulps_avx512vl(auVar55,auVar26);
              auVar52._0_4_ = (float)uVar4 * 0.5 + (float)(undefined4)uVar39 * 0.5;
              auVar52._4_4_ = (float)uVar14 * 0.5 + (float)uVar39._4_4_ * 0.5;
              auVar52._8_8_ = 0;
              auVar27._8_4_ = 0x3eaaaaaa;
              auVar27._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar27._12_4_ = 0x3eaaaaaa;
              auVar46 = vmulps_avx512vl(auVar52,auVar27);
              local_138 = (undefined1  [8])vmovlps_avx(auVar52);
              auVar56._0_4_ = auVar43._0_4_ + auVar45._0_4_;
              auVar56._4_4_ = auVar43._4_4_ + auVar45._4_4_;
              auVar56._8_4_ = auVar43._8_4_ + auVar45._8_4_;
              auVar56._12_4_ = auVar43._12_4_ + auVar45._12_4_;
              auVar58._0_4_ = auVar44._0_4_ + auVar46._0_4_;
              auVar58._4_4_ = auVar44._4_4_ + auVar46._4_4_;
              auVar58._8_4_ = auVar44._8_4_ + auVar46._8_4_;
              auVar58._12_4_ = auVar44._12_4_ + auVar46._12_4_;
              uVar12 = vmovlps_avx(auVar58);
              uStack_12c = (undefined4)uVar12;
              aStack_128._M_allocated_capacity._0_4_ = (undefined4)((ulong)uVar12 >> 0x20);
              aStack_128._8_8_ = vmovlps_avx(auVar56);
              uVar12 = vmovlps_avx(auVar60);
              uStack_114 = (undefined4)uVar12;
              uStack_110 = (undefined4)((ulong)uVar12 >> 0x20);
            }
            else {
              fVar47 = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.z;
              fVar2 = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.z;
              aStack_128._M_allocated_capacity._4_4_ = fVar47 * 0.6666666 + fVar2 * 0.33333334;
              uVar8 = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.x;
              uVar18 = pPVar1[2].super_Tuple3<pbrt::Point3,_float>.y;
              uVar9 = pPVar1[3].super_Tuple3<pbrt::Point3,_float>.x;
              uVar19 = pPVar1[3].super_Tuple3<pbrt::Point3,_float>.y;
              fStack_118 = fVar47 * 0.3333333 + fVar2 * 0.6666667;
              fStack_130 = ((pPVar1->super_Tuple3<pbrt::Point3,_float>).z * 0.3333333 +
                           fVar47 * 0.6666667) * 0.5 +
                           (float)aStack_128._M_allocated_capacity._4_4_ * 0.5;
              uVar10 = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.x;
              uVar20 = pPVar1[1].super_Tuple3<pbrt::Point3,_float>.y;
              fStack_10c = fStack_118 * 0.5 +
                           (fVar2 * 0.6666666 +
                           pPVar1[3].super_Tuple3<pbrt::Point3,_float>.z * 0.33333334) * 0.5;
              uVar11 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
              uVar21 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
              auVar57._0_4_ = (float)uVar10 * 0.6666666 + (float)uVar8 * 0.33333334;
              auVar57._4_4_ = (float)uVar20 * 0.6666666 + (float)uVar18 * 0.33333334;
              auVar57._8_8_ = 0;
              auVar61._0_4_ = (float)uVar10 * 0.3333333 + (float)uVar8 * 0.6666667;
              auVar61._4_4_ = (float)uVar20 * 0.3333333 + (float)uVar18 * 0.6666667;
              auVar61._8_8_ = 0;
              auVar54._0_4_ =
                   ((float)uVar10 * 0.6666667 + (float)uVar11 * 0.3333333) * 0.5 +
                   auVar57._0_4_ * 0.5;
              auVar54._4_4_ =
                   ((float)uVar20 * 0.6666667 + (float)uVar21 * 0.3333333) * 0.5 +
                   auVar57._4_4_ * 0.5;
              auVar54._8_8_ = 0;
              auVar59._0_4_ =
                   auVar61._0_4_ * 0.5 +
                   ((float)uVar8 * 0.6666666 + (float)uVar9 * 0.33333334) * 0.5;
              auVar59._4_4_ =
                   auVar61._4_4_ * 0.5 +
                   ((float)uVar18 * 0.6666666 + (float)uVar19 * 0.33333334) * 0.5;
              auVar59._8_8_ = 0;
              local_138 = (undefined1  [8])vmovlps_avx(auVar54);
              uVar12 = vmovlps_avx(auVar57);
              uStack_12c = (undefined4)uVar12;
              aStack_128._M_allocated_capacity._0_4_ = (undefined4)((ulong)uVar12 >> 0x20);
              aStack_128._8_8_ = vmovlps_avx(auVar61);
              uVar12 = vmovlps_avx(auVar59);
              uStack_114 = (undefined4)uVar12;
              uStack_110 = (undefined4)((ulong)uVar12 >> 0x20);
            }
            iVar36 = 1;
          }
          iVar40 = (int)lVar38;
          local_40 = 0;
          if (local_d0.
              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_d0.
              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_40 = (long)&((local_d0.
                                super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_Tuple3<pbrt::Normal3,_float>).x + lVar42;
          }
          lVar38 = lVar38 + 1;
          uVar28 = (uint)(local_d0.
                          super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                         local_d0.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 2;
          uStack_38 = (ulong)uVar28;
          fVar47 = (float)iVar40 / (float)local_100;
          auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_f8 * fVar47)),ZEXT416((uint)local_b4),
                                    ZEXT416((uint)(1.0 - fVar47)));
          fVar47 = (float)(int)lVar38 / (float)local_100;
          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(local_f8 * fVar47)),ZEXT416((uint)local_b4),
                                    ZEXT416((uint)(1.0 - fVar47)));
          norm.n._0_4_ = uVar28;
          norm.ptr = (Normal3<float> *)local_40;
          norm.n._4_4_ = 0;
          c_00.n = 4;
          c_00.ptr = (Point3<float> *)local_138;
          CreateCurve((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                       *)local_b0,local_58,local_50,reverseOrientation,c_00,auVar43._0_4_,
                      auVar44._0_4_,local_f4,norm,local_b8,alloc);
          pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
          insert<pbrt::ShapeHandle*>
                    ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>
                      *)__return_storage_ptr__,
                     __return_storage_ptr__->ptr + __return_storage_ptr__->nStored,
                     (ShapeHandle *)local_b0._8_8_,
                     (ShapeHandle *)(local_b0._8_8_ + local_b0._24_8_ * 8));
          iVar35 = iVar35 + iVar36;
          pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
          ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
                  )local_b0);
          lVar42 = lVar42 + 0xc;
        } while (lVar38 < local_100);
      }
    }
    if (local_d0.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_90.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0021bb25:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<ShapeHandle> Curve::Create(const Transform *renderFromObject,
                                        const Transform *objectFromRender,
                                        bool reverseOrientation,
                                        const ParameterDictionary &parameters,
                                        const FileLoc *loc, Allocator alloc) {
    Float width = parameters.GetOneFloat("width", 1.f);
    Float width0 = parameters.GetOneFloat("width0", width);
    Float width1 = parameters.GetOneFloat("width1", width);

    int degree = parameters.GetOneInt("degree", 3);
    if (degree != 2 && degree != 3) {
        Error(loc, "Invalid degree %d: only degree 2 and 3 curves are supported.",
              degree);
        return {};
    }

    std::string basis = parameters.GetOneString("basis", "bezier");
    if (basis != "bezier" && basis != "bspline") {
        Error(loc,
              "Invalid basis \"%s\": only \"bezier\" and \"bspline\" are "
              "supported.",
              basis);
        return {};
    }

    int nSegments;
    std::vector<Point3f> cp = parameters.GetPoint3fArray("P");
    if (basis == "bezier") {
        // After the first segment, which uses degree+1 control points,
        // subsequent segments reuse the last control point of the previous
        // one and then use degree more control points.
        if (((cp.size() - 1 - degree) % degree) != 0) {
            Error(loc,
                  "Invalid number of control points %d: for the degree %d "
                  "Bezier basis %d + n * %d are required, for n >= 0.",
                  (int)cp.size(), degree, degree + 1, degree);
            return {};
        }
        nSegments = (cp.size() - 1) / degree;
    } else {
        if (cp.size() < degree + 1) {
            Error(loc,
                  "Invalid number of control points %d: for the degree %d "
                  "b-spline basis, must have >= %d.",
                  int(cp.size()), degree, degree + 1);
            return {};
        }
        nSegments = cp.size() - degree;
    }

    CurveType type;
    std::string curveType = parameters.GetOneString("type", "flat");
    if (curveType == "flat")
        type = CurveType::Flat;
    else if (curveType == "ribbon")
        type = CurveType::Ribbon;
    else if (curveType == "cylinder")
        type = CurveType::Cylinder;
    else {
        Error(loc, R"(Unknown curve type "%s".  Using "cylinder".)", curveType);
        type = CurveType::Cylinder;
    }

    std::vector<Normal3f> n = parameters.GetNormal3fArray("N");
    if (!n.empty()) {
        if (type != CurveType::Ribbon) {
            Warning("Curve normals are only used with \"ribbon\" type curves.");
            n = {};
        } else if (n.size() != nSegments + 1) {
            Error(loc,
                  "Invalid number of normals %d: must provide %d normals for "
                  "ribbon "
                  "curves with %d segments.",
                  int(n.size()), nSegments + 1, nSegments);
            return {};
        }
    } else if (type == CurveType::Ribbon) {
        Error(loc, "Must provide normals \"N\" at curve endpoints with ribbon "
                   "curves.");
        return {};
    }

    int sd = parameters.GetOneInt("splitdepth", 3);

    if (type == CurveType::Ribbon && n.empty()) {
        Error(loc, "Must provide normals \"N\" at curve endpoints with ribbon "
                   "curves.");
        return {};
    }

    pstd::vector<ShapeHandle> curves(alloc);
    // Pointer to the first control point for the current segment. This is
    // updated after each loop iteration depending on the current basis.
    int cpOffset = 0;
    for (int seg = 0; seg < nSegments; ++seg) {
        pstd::array<Point3f, 4> segCpBezier;

        // First, compute the cubic Bezier control points for the current
        // segment and store them in segCpBezier. (It is admittedly
        // wasteful storage-wise to turn b-splines into Bezier segments and
        // wasteful computationally to turn quadratic curves into cubics,
        // but yolo.)
        if (basis == "bezier") {
            if (degree == 2) {
                // Elevate to degree 3.
                segCpBezier = ElevateQuadraticBezierToCubic(
                    pstd::MakeConstSpan(cp).subspan(cpOffset, 3));
            } else {
                // All set.
                for (int i = 0; i < 4; ++i)
                    segCpBezier[i] = cp[cpOffset + i];
            }
            cpOffset += degree;
        } else {
            // Uniform b-spline.
            if (degree == 2) {
                pstd::array<Point3f, 3> bezCp = QuadraticBSplineToBezier(
                    pstd::MakeConstSpan(cp).subspan(cpOffset, 3));
                segCpBezier = ElevateQuadraticBezierToCubic(pstd::MakeConstSpan(bezCp));
            } else {
                segCpBezier =
                    CubicBSplineToBezier(pstd::MakeConstSpan(cp).subspan(cpOffset, 4));
            }
            ++cpOffset;
        }

        pstd::span<const Normal3f> nspan;
        if (!n.empty())
            nspan = pstd::MakeSpan(&n[seg], 2);
        auto c =
            CreateCurve(renderFromObject, objectFromRender, reverseOrientation,
                        segCpBezier, Lerp(Float(seg) / Float(nSegments), width0, width1),
                        Lerp(Float(seg + 1) / Float(nSegments), width0, width1), type,
                        nspan, sd, alloc);
        curves.insert(curves.end(), c.begin(), c.end());
    }
    return curves;
}